

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement
          (cmNinjaTargetGenerator *this,cmSourceFile *source,string *config,string *fileConfig,
          bool firstForConfig)

{
  cmMakefile *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  size_type __last;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pbVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  FortranPreprocess FVar16;
  cmGlobalNinjaGenerator *pcVar17;
  string *psVar18;
  cmValue cVar19;
  mapped_type *pmVar20;
  mapped_type *defines;
  mapped_type *includes;
  mapped_type *pmVar21;
  MapToNinjaPathImpl MVar22;
  cmCustomCommand *pcVar23;
  mapped_type *this_00;
  cmGeneratedFileStream *pcVar24;
  iterator iVar25;
  cmValue args;
  string *psVar26;
  cmGeneratorTarget *target;
  string *arch;
  pointer pbVar27;
  _Alloc_hider _Var28;
  cmNinjaTargetGenerator *pcVar29;
  string_view arg;
  string_view arg_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view str;
  string_view value;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  string_view source_04;
  string_view source_05;
  string repVar;
  string modmapFormatVar;
  string ddModmapFile_1;
  string dyndep;
  string language;
  allocator<char> local_53a;
  allocator<char> local_539;
  string objectFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcSuffixes;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchSources;
  string pchSource;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  char local_3b8 [32];
  string *local_398;
  string ddModmapFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceDirectory;
  string ppFileName;
  string objectFileDir;
  string sourceFilePath;
  undefined1 local_2b0 [136];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  string local_1b0 [32];
  string scanRuleName;
  string modmapFormat;
  string objectDir;
  string srcpp;
  string cmakeVarLang;
  string local_f0;
  string local_d0;
  string cmakeLinkVar;
  string local_90;
  string local_70;
  string local_50;
  
  local_398 = fileConfig;
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  GetCompiledSourceNinjaPath_abi_cxx11_(&sourceFilePath,this,source);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&repVar,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_2b0._0_8_ = repVar._M_string_length;
  local_2b0._8_8_ = repVar._M_dataplus._M_p;
  pcVar17 = GetGlobalGenerator(this);
  (*(pcVar17->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&modmapFormatVar,pcVar17,config);
  pchSource._M_dataplus._M_p = (pointer)modmapFormatVar._M_string_length;
  pchSource._M_string_length = (size_type)modmapFormatVar._M_dataplus._M_p;
  cmStrCat<>((string *)&pchSources,(cmAlphaNum *)local_2b0,(cmAlphaNum *)&pchSource);
  psVar18 = ConvertToNinjaPath(this,(string *)&pchSources);
  std::__cxx11::string::string((string *)&objectDir,(string *)psVar18);
  std::__cxx11::string::~string((string *)&pchSources);
  std::__cxx11::string::~string((string *)&modmapFormatVar);
  std::__cxx11::string::~string((string *)&repVar);
  GetObjectFilePath((string *)local_2b0,this,source,config);
  psVar18 = ConvertToNinjaPath(this,(string *)local_2b0);
  std::__cxx11::string::string((string *)&objectFileName,(string *)psVar18);
  std::__cxx11::string::~string((string *)local_2b0);
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  local_2b0._0_8_ = &DAT_00000006;
  local_2b0._8_8_ = "CMAKE_";
  pchSource._M_dataplus._M_p = (pointer)language._M_string_length;
  pchSource._M_string_length = (size_type)language._M_dataplus._M_p;
  cmStrCat<>(&cmakeVarLang,(cmAlphaNum *)local_2b0,(cmAlphaNum *)&pchSource);
  local_2b0._0_8_ = cmakeVarLang._M_string_length;
  local_2b0._8_8_ = cmakeVarLang._M_dataplus._M_p;
  pchSource._M_dataplus._M_p = &DAT_00000013;
  pchSource._M_string_length = (size_type)anon_var_dwarf_e57143;
  cmStrCat<>(&cmakeLinkVar,(cmAlphaNum *)local_2b0,(cmAlphaNum *)&pchSource);
  cVar19 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&cmakeLinkVar);
  bVar12 = std::operator==(&language,"RC");
  if (bVar12) {
LAB_002fdaa3:
    bVar12 = false;
  }
  else {
    bVar12 = std::operator==(&language,"CUDA");
    if ((bVar12) && (cVar19.Value == (string *)0x0)) goto LAB_002fdaa3;
    bVar12 = ForceResponseFile(this);
  }
  LanguageCompilerRule(&local_50,this,&language,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_2b0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ComputeFlagsForObject(&pchSource,this,source,&language,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pchSources,"FLAGS",(allocator<char> *)&repVar);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e0,(key_type *)&pchSources);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&pchSource);
  std::__cxx11::string::~string((string *)&pchSources);
  std::__cxx11::string::~string((string *)&pchSource);
  ComputeDefines(&pchSource,this,source,&language,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pchSources,"DEFINES",(allocator<char> *)&repVar);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e0,(key_type *)&pchSources);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&pchSource);
  std::__cxx11::string::~string((string *)&pchSources);
  std::__cxx11::string::~string((string *)&pchSource);
  ComputeIncludes(&pchSource,this,source,&language,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pchSources,"INCLUDES",(allocator<char> *)&repVar);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e0,(key_type *)&pchSources);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&pchSource);
  std::__cxx11::string::~string((string *)&pchSources);
  std::__cxx11::string::~string((string *)&pchSource);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  pchSource._M_dataplus._M_p = &DAT_00000006;
  pchSource._M_string_length = (long)"The CMAKE_" + 4;
  pchSources._M_h._M_buckets = (__buckets_ptr)language._M_string_length;
  pchSources._M_h._M_bucket_count = (size_type)language._M_dataplus._M_p;
  cmStrCat<char[16]>(&repVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&pchSources,
                     (char (*) [16])0x5e0d47);
  psVar18 = cmMakefile::GetSafeDefinition(pcVar1,&repVar);
  __x._M_str = (psVar18->_M_dataplus)._M_p;
  __x._M_len = psVar18->_M_string_length;
  __y._M_str = "msvc";
  __y._M_len = 4;
  bVar13 = std::operator!=(__x,__y);
  std::__cxx11::string::~string((string *)&repVar);
  if (bVar13) {
    if (language._M_string_length == 0) {
LAB_002fdea1:
      pcVar2 = this->LocalGenerator;
      pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      pchSources._M_h._M_buckets = (__buckets_ptr)0x2;
      pchSources._M_h._M_bucket_count = (size_type)anon_var_dwarf_e57630;
      cmStrCat<>(&modmapFormatVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&pchSources);
      source_01._M_str = modmapFormatVar._M_dataplus._M_p;
      source_01._M_len = modmapFormatVar._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&repVar,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,source_01,SHELL);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dyndep,"DEP_FILE",(allocator<char> *)&ddModmapFile_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1e0,&dyndep);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
      std::__cxx11::string::~string((string *)&dyndep);
      std::__cxx11::string::~string((string *)&repVar);
      psVar18 = &modmapFormatVar;
    }
    else {
      pchSource._M_dataplus._M_p = &DAT_00000006;
      pchSource._M_string_length = (long)"The CMAKE_" + 4;
      pchSources._M_h._M_buckets = (__buckets_ptr)language._M_string_length;
      pchSources._M_h._M_bucket_count = (size_type)language._M_dataplus._M_p;
      cmStrCat<char[27]>(&repVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&pchSources,
                         (char (*) [27])"_DEPFILE_EXTENSION_REPLACE");
      bVar13 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&repVar);
      std::__cxx11::string::~string((string *)&repVar);
      if (!bVar13) goto LAB_002fdea1;
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&modmapFormatVar,&objectFileName);
      pchSource._M_dataplus._M_p = (pointer)modmapFormatVar._M_string_length;
      pchSource._M_string_length = (size_type)modmapFormatVar._M_dataplus._M_p;
      pchSources._M_h._M_buckets = (__buckets_ptr)0x2;
      pchSources._M_h._M_bucket_count = (size_type)anon_var_dwarf_e57630;
      cmStrCat<>(&repVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&pchSources);
      std::__cxx11::string::~string((string *)&modmapFormatVar);
      pcVar2 = this->LocalGenerator;
      pchSource._M_dataplus._M_p = (pointer)objectFileDir._M_string_length;
      pchSource._M_string_length = (size_type)objectFileDir._M_dataplus._M_p;
      pchSources._M_h._M_bucket_count = (size_type)&pchSources._M_h._M_before_begin;
      pchSources._M_h._M_buckets = (__buckets_ptr)0x1;
      pchSources._M_h._M_before_begin._M_nxt._0_1_ = 0x2f;
      cmStrCat<std::__cxx11::string>
                (&dyndep,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&pchSources,&repVar);
      source_00._M_str = dyndep._M_dataplus._M_p;
      source_00._M_len = dyndep._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&modmapFormatVar,
                 &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source_00,SHELL);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ddModmapFile_1,"DEP_FILE",(allocator<char> *)&ispcSuffixes);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1e0,&ddModmapFile_1);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&modmapFormatVar);
      std::__cxx11::string::~string((string *)&ddModmapFile_1);
      std::__cxx11::string::~string((string *)&modmapFormatVar);
      std::__cxx11::string::~string((string *)&dyndep);
      psVar18 = &repVar;
    }
    std::__cxx11::string::~string((string *)psVar18);
  }
  if (firstForConfig) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"FLAGS",(allocator<char> *)&modmapFormatVar);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_1e0,&pchSource);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSources,"DEFINES",(allocator<char> *)&dyndep);
    defines = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_1e0,(key_type *)&pchSources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"INCLUDES",(allocator<char> *)&ddModmapFile_1);
    includes = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_1e0,&repVar);
    ExportObjectCompileCommand
              (this,&language,&sourceFilePath,&objectDir,&objectFileName,&objectFileDir,pmVar20,
               defines,includes,config);
    std::__cxx11::string::~string((string *)&repVar);
    std::__cxx11::string::~string((string *)&pchSources);
    std::__cxx11::string::~string((string *)&pchSource);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2b0 + 0x40),&objectFileName);
  if (firstForConfig) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"CMAKE_PCH_EXTENSION",(allocator<char> *)&pchSources);
    cVar19 = cmMakefile::GetDefinition(pcVar1,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    str._M_str = objectFileName._M_dataplus._M_p;
    str._M_len = objectFileName._M_string_length;
    bVar13 = cmHasSuffix(str,cVar19);
    if (!bVar13) {
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                ::operator[](&this->Configs,config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar21->Objects,&objectFileName);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_228,&sourceFilePath);
  depList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetAppleArchs
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,&architectures);
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&architectures);
  }
  pbVar4 = architectures.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pchSources._M_h._M_buckets = &pchSources._M_h._M_single_bucket;
  pchSources._M_h._M_bucket_count = 1;
  pchSources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pchSources._M_h._M_element_count = 0;
  pchSources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pchSources._M_h._M_rehash_policy._M_next_resize = 0;
  pchSources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (pbVar27 = architectures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar27 != pbVar4; pbVar27 = pbVar27 + 1
      ) {
    cmGeneratorTarget::GetPchSource
              (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,&language,
               pbVar27);
    if (pchSource._M_string_length != 0) {
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pchSources,&pchSource);
    }
    std::__cxx11::string::~string((string *)&pchSource);
  }
  if (pchSources._M_h._M_element_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"SKIP_PRECOMPILE_HEADERS",(allocator<char> *)&repVar);
    cVar19 = cmSourceFile::GetProperty(source,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    pbVar4 = architectures.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (cVar19.Value == (string *)0x0) {
      for (pbVar27 = architectures.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar27 != pbVar4;
          pbVar27 = pbVar27 + 1) {
        cmGeneratorTarget::GetPchHeader
                  (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,&language
                   ,pbVar27);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depList,
                   &pchSource);
        std::__cxx11::string::~string((string *)&pchSource);
        psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(source);
        iVar25 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&pchSources._M_h,psVar18);
        if (iVar25.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          cmGeneratorTarget::GetPchFile
                    (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
                     &language,pbVar27);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depList,
                     &pchSource);
          std::__cxx11::string::~string((string *)&pchSource);
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pchSource,"OBJECT_DEPENDS",(allocator<char> *)&repVar);
  cVar19 = cmSourceFile::GetProperty(source,&pchSource);
  std::__cxx11::string::~string((string *)&pchSource);
  if (cVar19.Value != (string *)0x0) {
    arg._M_str = ((cVar19.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar19.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pchSource,arg,false);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pchSource._M_dataplus._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pchSource._M_string_length,&depList);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pchSource);
  }
  pbVar4 = depList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (depList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      depList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (pbVar27 = depList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = depList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pbVar5 = depList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, pbVar27 != pbVar4; pbVar27 = pbVar27 + 1
        ) {
      bVar13 = cmsys::SystemTools::FileIsFullPath(pbVar27);
      if (bVar13) {
        cmsys::SystemTools::CollapseFullPath(&pchSource,pbVar27);
        std::__cxx11::string::operator=((string *)pbVar27,(string *)&pchSource);
        std::__cxx11::string::~string((string *)&pchSource);
      }
    }
    MVar22.GG = GetGlobalGenerator(this);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )pbVar6,&vStack_210,MVar22);
  }
  OrderDependsTargetForTarget(&pchSource,this,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
             &pchSource);
  std::__cxx11::string::~string((string *)&pchSource);
  bVar13 = cmSourceFile::GetIsGenerated(source,GlobalAndLocal);
  if (bVar13) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"__CMAKE_GENERATED_BY_CMAKE",(allocator<char> *)&repVar);
    bVar13 = cmSourceFile::GetPropertyAsBool(source,&pchSource);
    if (!bVar13) {
      pcVar23 = cmSourceFile::GetCustomCommand(source);
      if (pcVar23 == (cmCustomCommand *)0x0) {
        pcVar17 = GetGlobalGenerator(this);
        bVar13 = cmGlobalNinjaGenerator::HasCustomCommandOutput(pcVar17,&sourceFilePath);
        std::__cxx11::string::~string((string *)&pchSource);
        if (!bVar13) {
          pcVar17 = GetGlobalGenerator(this);
          cmGlobalNinjaGenerator::AddAssumedSourceDependencies
                    (pcVar17,&sourceFilePath,(cmNinjaDeps *)&local_1f8);
        }
        goto LAB_002fe403;
      }
    }
    std::__cxx11::string::~string((string *)&pchSource);
  }
LAB_002fe403:
  bVar13 = NeedDyndep(this,&language,config);
  bVar14 = std::operator==(&language,"Fortran");
  modmapFormat._M_dataplus._M_p = (pointer)&modmapFormat.field_2;
  modmapFormat._M_string_length = 0;
  modmapFormat.field_2._M_local_buf[0] = '\0';
  if (bVar13) {
    pchSource._M_dataplus._M_p = &DAT_00000013;
    pchSource._M_string_length = (size_type)anon_var_dwarf_e57167;
    repVar._M_dataplus._M_p = (pointer)language._M_string_length;
    repVar._M_string_length = (size_type)language._M_dataplus._M_p;
    cmStrCat<char[19]>(&modmapFormatVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&repVar,
                       (char (*) [19])"_MODULE_MAP_FORMAT");
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,&modmapFormatVar);
    std::__cxx11::string::_M_assign((string *)&modmapFormat);
    std::__cxx11::string::~string((string *)&modmapFormatVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"Fortran_PREPROCESS",(allocator<char> *)&repVar);
    psVar18 = cmSourceFile::GetSafeProperty(source,&pchSource);
    std::__cxx11::string::string((string *)&srcpp,(string *)psVar18);
    std::__cxx11::string::~string((string *)&pchSource);
    value._M_str = srcpp._M_dataplus._M_p;
    value._M_len = srcpp._M_string_length;
    FVar16 = cmOutputConverter::GetFortranPreprocess(value);
    if (FVar16 == Unset) {
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pchSource,"Fortran_PREPROCESS",(allocator<char> *)&repVar);
      psVar18 = cmGeneratorTarget::GetSafeProperty(pcVar3,&pchSource);
      std::__cxx11::string::~string((string *)&pchSource);
      value_00._M_str = (psVar18->_M_dataplus)._M_p;
      value_00._M_len = psVar18->_M_string_length;
      FVar16 = cmOutputConverter::GetFortranPreprocess(value_00);
    }
    bVar13 = FVar16 == NotNeeded;
    if (!bVar14 || bVar13) {
      bVar15 = false;
    }
    else {
      bVar15 = CompileWithDefines(this,&language);
    }
    scanRuleName._M_dataplus._M_p = (pointer)&scanRuleName.field_2;
    scanRuleName._M_string_length = 0;
    ppFileName._M_dataplus._M_p = (pointer)&ppFileName.field_2;
    ppFileName._M_string_length = 0;
    scanRuleName.field_2._M_local_buf[0] = '\0';
    ppFileName.field_2._M_local_buf[0] = '\0';
    if (!bVar14 || bVar13) {
      LanguageScanRule(&pchSource,this,&language,config);
      std::__cxx11::string::operator=((string *)&scanRuleName,(string *)&pchSource);
      std::__cxx11::string::~string((string *)&pchSource);
      pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      repVar._M_dataplus._M_p = &DAT_00000006;
      repVar._M_string_length = (size_type)anon_var_dwarf_e57671;
      cmStrCat<>(&modmapFormatVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&repVar);
      psVar18 = &modmapFormatVar;
      std::__cxx11::string::operator=((string *)&ppFileName,(string *)psVar18);
    }
    else {
      LanguagePreprocessAndScanRule(&pchSource,this,&language,config);
      std::__cxx11::string::operator=((string *)&scanRuleName,(string *)&pchSource);
      std::__cxx11::string::~string((string *)&pchSource);
      GetPreprocessedFilePath(&pchSource,this,source,config);
      ConvertToNinjaPath(this,&pchSource);
      std::__cxx11::string::_M_assign((string *)&ppFileName);
      psVar18 = &pchSource;
    }
    std::__cxx11::string::~string((string *)psVar18);
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&dyndep,(string *)&scanRuleName);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&pchSource,&dyndep);
    std::__cxx11::string::~string((string *)&dyndep);
    std::__cxx11::string::assign(local_3b8);
    pbVar11 = local_400.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar10 = local_400.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = local_400.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = vStack_418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar7 = vStack_418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar6 = vStack_418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = local_430.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar27 = local_430.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_430.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar14 || bVar13) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_430,&local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&vStack_418,&vStack_210);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_400,&local_1f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"IN_ABS",(allocator<char> *)&ddModmapFile_1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_1e0,&repVar);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&modmapFormatVar,"IN_ABS",(allocator<char> *)&ispcSuffixes);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_3e8,&modmapFormatVar);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      std::__cxx11::string::~string((string *)&modmapFormatVar);
      std::__cxx11::string::~string((string *)&repVar);
    }
    else {
      local_430.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_430.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar4;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar27;
      local_430.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vStack_210.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar5;
      vStack_210.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar6;
      vStack_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_210.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      vStack_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_210.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_210.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
      vStack_210.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar8;
      local_400.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_400.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_400.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar9;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"IN_ABS",(allocator<char> *)&ddModmapFile_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_3e8,&repVar);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&modmapFormatVar,"IN_ABS",(allocator<char> *)&ispcSuffixes);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_1e0,&modmapFormatVar);
      std::__cxx11::string::swap((string *)pmVar20);
      std::__cxx11::string::~string((string *)&modmapFormatVar);
      std::__cxx11::string::~string((string *)&repVar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_228,&ppFileName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"FLAGS",(allocator<char> *)&ddModmapFile_1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1e0,&repVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&modmapFormatVar,"FLAGS",(allocator<char> *)&ispcSuffixes);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_3e8,&modmapFormatVar);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    std::__cxx11::string::~string((string *)&modmapFormatVar);
    std::__cxx11::string::~string((string *)&repVar);
    if (bVar15 == false && (bVar14 && !bVar13)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"DEFINES",(allocator<char> *)&ddModmapFile_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_3e8,&repVar);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&modmapFormatVar,"DEFINES",(allocator<char> *)&ispcSuffixes);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_1e0,&modmapFormatVar);
      std::__cxx11::string::swap((string *)pmVar20);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"DEFINES",(allocator<char> *)&ddModmapFile_1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_1e0,&repVar);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&modmapFormatVar,"DEFINES",(allocator<char> *)&ispcSuffixes);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_3e8,&modmapFormatVar);
      std::__cxx11::string::_M_assign((string *)pmVar20);
    }
    std::__cxx11::string::~string((string *)&modmapFormatVar);
    std::__cxx11::string::~string((string *)&repVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"INCLUDES",(allocator<char> *)&ddModmapFile_1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1e0,&repVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&modmapFormatVar,"INCLUDES",(allocator<char> *)&ispcSuffixes);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_3e8,&modmapFormatVar);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    std::__cxx11::string::~string((string *)&modmapFormatVar);
    std::__cxx11::string::~string((string *)&repVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"OBJ_FILE",(allocator<char> *)&modmapFormatVar);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_3e8,&repVar);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    std::__cxx11::string::~string((string *)&repVar);
    repVar._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
    repVar._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
    modmapFormatVar._M_dataplus._M_p = (pointer)0x4;
    modmapFormatVar._M_string_length = (size_type)anon_var_dwarf_dc04c2;
    cmStrCat<>(&ddModmapFile_1,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"DYNDEP_INTERMEDIATE_FILE",(allocator<char> *)&modmapFormatVar);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_3e8,&repVar);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    std::__cxx11::string::~string((string *)&repVar);
    if (!bVar14 || bVar13) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_478,&ddModmapFile_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"PREPROCESSED_OUTPUT_FILE",(allocator<char> *)&modmapFormatVar);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_3e8,&repVar);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      std::__cxx11::string::~string((string *)&repVar);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_478,&ppFileName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_460,&ddModmapFile_1);
    }
    repVar._M_string_length =
         (size_type)
         ((local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    repVar._M_dataplus._M_p =
         (pointer)(local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    modmapFormatVar._M_dataplus._M_p = (pointer)0x2;
    modmapFormatVar._M_string_length = (size_type)anon_var_dwarf_e57630;
    cmStrCat<>((string *)&ispcSuffixes,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar);
    source_02._M_str =
         (char *)ispcSuffixes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    source_02._M_len =
         (size_t)ispcSuffixes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&repVar,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,source_02,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&modmapFormatVar,"DEP_FILE",(allocator<char> *)&ddModmapFile);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_3e8,&modmapFormatVar);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&repVar);
    std::__cxx11::string::~string((string *)&modmapFormatVar);
    std::__cxx11::string::~string((string *)&repVar);
    if (bVar14 && !bVar13) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"DEP_FILE",(allocator<char> *)&modmapFormatVar);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&local_1e0,&repVar);
      std::__cxx11::string::~string((string *)&repVar);
    }
    if (modmapFormat._M_string_length != 0) {
      repVar._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      repVar._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      modmapFormatVar._M_dataplus._M_p = (pointer)0x7;
      modmapFormatVar._M_string_length = (size_type)anon_var_dwarf_dc028e;
      cmStrCat<>(&ddModmapFile,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"DYNDEP_MODULE_MAP_FILE",(allocator<char> *)&modmapFormatVar);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&local_3e8,&repVar);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      std::__cxx11::string::~string((string *)&repVar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_460,&ddModmapFile);
      std::__cxx11::string::~string((string *)&ddModmapFile);
    }
    std::__cxx11::string::~string((string *)&ispcSuffixes);
    std::__cxx11::string::~string((string *)&ddModmapFile_1);
    if (bVar14 && !bVar13) {
      pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
      repVar._M_dataplus._M_p = &DAT_00000006;
      repVar._M_string_length = (long)"The CMAKE_" + 4;
      modmapFormatVar._M_dataplus._M_p = (pointer)language._M_string_length;
      modmapFormatVar._M_string_length = (size_type)language._M_dataplus._M_p;
      cmStrCat<char[18]>(&dyndep,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar,
                         (char (*) [18])"_POSTPROCESS_FLAG");
      psVar18 = cmMakefile::GetSafeDefinition(pcVar1,&dyndep);
      std::__cxx11::string::~string((string *)&dyndep);
      pcVar2 = this->LocalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"FLAGS",(allocator<char> *)&modmapFormatVar);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1e0,&repVar);
      (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar2,pmVar20,psVar18);
      std::__cxx11::string::~string((string *)&repVar);
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory(&repVar,psVar18);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &sourceDirectory,&repVar);
      std::__cxx11::string::~string((string *)&repVar);
      cmLocalGenerator::GetIncludeFlags
                (&dyndep,(cmLocalGenerator *)this->LocalGenerator,&sourceDirectory,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget,&language,config,false);
      repVar._M_dataplus._M_p = (pointer)dyndep._M_string_length;
      repVar._M_string_length = (size_type)dyndep._M_dataplus._M_p;
      modmapFormatVar._M_string_length = (size_type)&modmapFormatVar.field_2;
      modmapFormatVar._M_dataplus._M_p = (pointer)0x1;
      modmapFormatVar.field_2._M_local_buf[0] = ' ';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ispcSuffixes,"INCLUDES",&local_539);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1e0,(key_type *)&ispcSuffixes);
      cmStrCat<std::__cxx11::string>
                (&ddModmapFile_1,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar,pmVar20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ddModmapFile,"INCLUDES",&local_53a);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1e0,&ddModmapFile);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&ddModmapFile_1);
      std::__cxx11::string::~string((string *)&ddModmapFile);
      std::__cxx11::string::~string((string *)&ddModmapFile_1);
      std::__cxx11::string::~string((string *)&ispcSuffixes);
      std::__cxx11::string::~string((string *)&dyndep);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sourceDirectory);
    }
    if (firstForConfig) {
      repVar._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      repVar._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      modmapFormatVar._M_dataplus._M_p = (pointer)0x4;
      modmapFormatVar._M_string_length = (size_type)anon_var_dwarf_dc04c2;
      cmStrCat<>(&dyndep,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar);
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                ::operator[](&this->Configs,config);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&pmVar21->DDIFiles,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&dyndep);
      std::__cxx11::string::~string((string *)&dyndep);
    }
    pcVar29 = (cmNinjaTargetGenerator *)&repVar;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pcVar29,"JOB_POOL_COMPILE",(allocator<char> *)&modmapFormatVar);
    addPoolNinjaVariable
              (pcVar29,&repVar,(this->super_cmCommonTargetGenerator).GeneratorTarget,&local_3e8);
    std::__cxx11::string::~string((string *)&repVar);
    pcVar17 = GetGlobalGenerator(this);
    pcVar24 = GetImplFileStream(this,local_398);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar17,(ostream *)pcVar24,(cmNinjaBuild *)&pchSource,-(uint)bVar12,(bool *)0x0);
    GetDyndepFilePath(&dyndep,this,&language,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_1f8,&dyndep);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"dyndep",(allocator<char> *)&modmapFormatVar);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_1e0,&repVar);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    std::__cxx11::string::~string((string *)&repVar);
    if (modmapFormat._M_string_length != 0) {
      repVar._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
      repVar._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
      modmapFormatVar._M_dataplus._M_p = (pointer)0x7;
      modmapFormatVar._M_string_length = (size_type)anon_var_dwarf_dc028e;
      cmStrCat<>(&ddModmapFile_1,(cmAlphaNum *)&repVar,(cmAlphaNum *)&modmapFormatVar);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&repVar,"DYNDEP_MODULE_MAP_FILE",(allocator<char> *)&modmapFormatVar);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_1e0,&repVar);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      std::__cxx11::string::~string((string *)&repVar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1f8,&ddModmapFile_1);
      std::__cxx11::string::~string((string *)&ddModmapFile_1);
    }
    std::__cxx11::string::~string((string *)&dyndep);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&pchSource);
    std::__cxx11::string::~string((string *)&ppFileName);
    std::__cxx11::string::~string((string *)&scanRuleName);
    std::__cxx11::string::~string((string *)&srcpp);
  }
  EnsureParentDirectoryExists(this,&objectFileName);
  source_03._M_str = objectDir._M_dataplus._M_p;
  source_03._M_len = objectDir._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&pchSource,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,source_03,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&repVar,"OBJECT_DIR",(allocator<char> *)&modmapFormatVar);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e0,&repVar);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&pchSource);
  std::__cxx11::string::~string((string *)&repVar);
  std::__cxx11::string::~string((string *)&pchSource);
  source_04._M_str = objectFileDir._M_dataplus._M_p;
  source_04._M_len = objectFileDir._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&pchSource,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,source_04,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&repVar,"OBJECT_FILE_DIR",(allocator<char> *)&modmapFormatVar);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e0,&repVar);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&pchSource);
  std::__cxx11::string::~string((string *)&repVar);
  std::__cxx11::string::~string((string *)&pchSource);
  pcVar29 = (cmNinjaTargetGenerator *)&pchSource;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar29,"JOB_POOL_COMPILE",(allocator<char> *)&repVar);
  addPoolNinjaVariable
            (pcVar29,&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (cmNinjaVars *)&local_1e0);
  std::__cxx11::string::~string((string *)&pchSource);
  if (pchSources._M_h._M_element_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"SKIP_PRECOMPILE_HEADERS",(allocator<char> *)&repVar);
    cVar19 = cmSourceFile::GetProperty(source,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    if (cVar19.Value == (string *)0x0) {
      psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      iVar25 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&pchSources._M_h,psVar18);
      if (iVar25.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pcVar29 = (cmNinjaTargetGenerator *)&pchSource;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pcVar29,"JOB_POOL_PRECOMPILE_HEADER",(allocator<char> *)&repVar);
        addPoolNinjaVariable
                  (pcVar29,&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmNinjaVars *)&local_1e0);
        std::__cxx11::string::~string((string *)&pchSource);
      }
    }
  }
  SetMsvcTargetPdbVariable(this,(cmNinjaVars *)&local_1e0,config);
  pchSource._M_dataplus._M_p = (pointer)objectFileName._M_string_length;
  pchSource._M_string_length = (size_type)objectFileName._M_dataplus._M_p;
  repVar._M_dataplus._M_p = (pointer)0x4;
  repVar._M_string_length = (long)"deviceLinkLibs.rsp" + 0xe;
  cmStrCat<>(&modmapFormatVar,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&repVar);
  std::__cxx11::string::operator=(local_1b0,(string *)&modmapFormatVar);
  std::__cxx11::string::~string((string *)&modmapFormatVar);
  bVar13 = std::operator==(&language,"ISPC");
  if (bVar13) {
    psVar18 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&modmapFormatVar,psVar18);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&pchSource,&modmapFormatVar);
    std::__cxx11::string::operator=((string *)&modmapFormatVar,(string *)&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"ISPC_HEADER_SUFFIX",(allocator<char> *)&repVar);
    cVar19 = cmGeneratorTarget::GetProperty(pcVar3,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    if (cVar19.Value == (string *)0x0) {
      __assert_fail("ispcSuffixProp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                    ,0x613,
                    "void cmNinjaTargetGenerator::WriteObjectBuildStatement(const cmSourceFile *, const std::string &, const std::string &, bool)"
                   );
    }
    cmGeneratorTarget::GetObjectDirectory
              (&dyndep,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"ISPC_HEADER_DIRECTORY",(allocator<char> *)&repVar);
    args = cmGeneratorTarget::GetProperty(pcVar3,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    if (args.Value != (string *)0x0) {
      psVar26 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)this->LocalGenerator);
      pchSource._M_string_length = (size_type)(psVar26->_M_dataplus)._M_p;
      pchSource._M_dataplus._M_p = (pointer)psVar26->_M_string_length;
      repVar._M_string_length = (size_type)&repVar.field_2;
      repVar._M_dataplus._M_p = (pointer)0x1;
      repVar.field_2._M_local_buf[0] = '/';
      cmStrCat<std::__cxx11::string>
                (&ddModmapFile_1,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&repVar,args.Value);
      std::__cxx11::string::operator=((string *)&dyndep,(string *)&ddModmapFile_1);
      std::__cxx11::string::~string((string *)&ddModmapFile_1);
    }
    pchSource._M_dataplus._M_p = (pointer)dyndep._M_string_length;
    pchSource._M_string_length = (size_type)dyndep._M_dataplus._M_p;
    repVar._M_string_length = (size_type)&repVar.field_2;
    repVar._M_dataplus._M_p = (pointer)0x1;
    repVar.field_2._M_local_buf[0] = '/';
    cmStrCat<std::__cxx11::string,std::__cxx11::string>
              (&ddModmapFile_1,(cmAlphaNum *)&pchSource,(cmAlphaNum *)&repVar,&modmapFormatVar,
               cVar19.Value);
    ConvertToNinjaPath(this,&ddModmapFile_1);
    std::__cxx11::string::_M_assign((string *)&ddModmapFile_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b0 + 0x58),&ddModmapFile_1);
    pcVar17 = GetGlobalGenerator(this);
    std::__cxx11::string::string((string *)&local_d0,(string *)&ddModmapFile_1);
    cmGlobalNinjaGenerator::AddAdditionalCleanFile(pcVar17,&local_d0,config);
    std::__cxx11::string::~string((string *)&local_d0);
    detail::ComputeISPCObjectSuffixes_abi_cxx11_
              (&ispcSuffixes,(detail *)(this->super_cmCommonTargetGenerator).GeneratorTarget,target)
    ;
    if (0x20 < (ulong)((long)ispcSuffixes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)ispcSuffixes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      cmGeneratorTarget::GetObjectDirectory
                (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      detail::ComputeISPCExtraObjects
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ddModmapFile,psVar18,&pchSource,&ispcSuffixes);
      for (_Var28 = ddModmapFile._M_dataplus; _Var28._M_p != (pointer)ddModmapFile._M_string_length;
          _Var28._M_p = _Var28._M_p + 0x20) {
        std::__cxx11::string::string((string *)&repVar,(string *)_Var28._M_p);
        ConvertToNinjaPath(this,&repVar);
        std::__cxx11::string::_M_assign((string *)&repVar);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (local_2b0 + 0x58),&repVar);
        pcVar17 = GetGlobalGenerator(this);
        std::__cxx11::string::string((string *)&local_70,(string *)&repVar);
        cmGlobalNinjaGenerator::AddAdditionalCleanFile(pcVar17,&local_70,config);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&repVar);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ddModmapFile);
      std::__cxx11::string::~string((string *)&pchSource);
    }
    source_05._M_str = ddModmapFile_1._M_dataplus._M_p;
    source_05._M_len = ddModmapFile_1._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&pchSource,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_05,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&repVar,"ISPC_HEADER_FILE",(allocator<char> *)&ddModmapFile);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_1e0,&repVar);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&pchSource);
    std::__cxx11::string::~string((string *)&repVar);
    std::__cxx11::string::~string((string *)&pchSource);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ispcSuffixes);
    std::__cxx11::string::~string((string *)&ddModmapFile_1);
    std::__cxx11::string::~string((string *)&dyndep);
    std::__cxx11::string::~string((string *)&modmapFormatVar);
  }
  else {
    cmGeneratorTarget::GetGeneratedISPCHeaders
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
    __last = pchSource._M_string_length;
    _Var28 = pchSource._M_dataplus;
    if (pchSource._M_dataplus._M_p != (pointer)pchSource._M_string_length) {
      MVar22.GG = GetGlobalGenerator(this);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_Var28._M_p,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )_Var28._M_p,MVar22);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
                 (const_iterator)
                 local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pchSource._M_dataplus._M_p,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pchSource._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pchSource);
  }
  bVar13 = std::operator==(&language,"Swift");
  if (bVar13) {
    EmitSwiftDependencyInfo(this,source,config);
  }
  else {
    pcVar17 = GetGlobalGenerator(this);
    pcVar24 = GetImplFileStream(this,local_398);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar17,(ostream *)pcVar24,(cmNinjaBuild *)local_2b0,-(uint)bVar12,(bool *)0x0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pchSource,"OBJECT_OUTPUTS",(allocator<char> *)&repVar);
  cVar19 = cmSourceFile::GetProperty(source,&pchSource);
  std::__cxx11::string::~string((string *)&pchSource);
  if (cVar19.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_f0,(string *)cVar19.Value);
    pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
    pchSource._M_string_length = 0;
    pchSource.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&repVar,&local_f0,(cmLocalGenerator *)this->LocalGenerator,config,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    std::__cxx11::string::~string((string *)&local_f0);
    if (repVar._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"phony",(allocator<char> *)&modmapFormatVar);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&pchSource,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::assign((char *)&pchSource);
      arg_00._M_str = repVar._M_dataplus._M_p;
      arg_00._M_len = repVar._M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&modmapFormatVar,arg_00,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_478,&modmapFormatVar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&modmapFormatVar);
      MVar22.GG = GetGlobalGenerator(this);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_478.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,MVar22);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_430,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b0 + 0x40));
      pcVar17 = GetGlobalGenerator(this);
      pcVar24 = GetImplFileStream(this,local_398);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar17,(ostream *)pcVar24,(cmNinjaBuild *)&pchSource,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&pchSource);
    }
    std::__cxx11::string::~string((string *)&repVar);
  }
  std::__cxx11::string::~string((string *)&modmapFormat);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pchSources._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&architectures);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depList);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2b0);
  std::__cxx11::string::~string((string *)&cmakeLinkVar);
  std::__cxx11::string::~string((string *)&cmakeVarLang);
  std::__cxx11::string::~string((string *)&objectFileDir);
  std::__cxx11::string::~string((string *)&objectFileName);
  std::__cxx11::string::~string((string *)&objectDir);
  std::__cxx11::string::~string((string *)&sourceFilePath);
  std::__cxx11::string::~string((string *)&language);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source, const std::string& config,
  const std::string& fileConfig, bool firstForConfig)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFilePath = this->GetCompiledSourceNinjaPath(source);
  std::string const objectDir = this->ConvertToNinjaPath(
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             this->GetGlobalGenerator()->ConfigDirectory(config)));
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  std::string cmakeVarLang = cmStrCat("CMAKE_", language);

  // build response file name
  std::string cmakeLinkVar = cmStrCat(cmakeVarLang, "_RESPONSE_FILE_FLAG");

  cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

  bool const lang_supports_response =
    !(language == "RC" || (language == "CUDA" && !flag));
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaBuild objBuild(this->LanguageCompilerRule(language, config));
  cmNinjaVars& vars = objBuild.Variables;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language, config);
  vars["DEFINES"] = this->ComputeDefines(source, language, config);
  vars["INCLUDES"] = this->ComputeIncludes(source, language, config);

  if (this->GetMakefile()->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_DEPFILE_FORMAT")) != "msvc"_s) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar =
        cmStrCat("CMAKE_", language, "_DEPFILE_EXTENSION_REPLACE");
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmStrCat(objectFileName, ".d"), cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName = cmStrCat(
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName), ".d");
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmStrCat(objectFileDir, '/', dependFileName),
        cmOutputConverter::SHELL);
    }
  }

  if (firstForConfig) {
    this->ExportObjectCompileCommand(
      language, sourceFilePath, objectDir, objectFileName, objectFileDir,
      vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"], config);
  }

  objBuild.Outputs.push_back(objectFileName);
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      // Add this object to the list of object files.
      this->Configs[config].Objects.push_back(objectFileName);
    }
  }

  objBuild.ExplicitDeps.push_back(sourceFilePath);

  // Add precompile headers dependencies
  std::vector<std::string> depList;

  std::vector<std::string> architectures;
  this->GeneratorTarget->GetAppleArchs(config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::unordered_set<std::string> pchSources;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);

    if (!pchSource.empty()) {
      pchSources.insert(pchSource);
    }
  }

  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    for (const std::string& arch : architectures) {
      depList.push_back(
        this->GeneratorTarget->GetPchHeader(config, language, arch));
      if (pchSources.find(source->GetFullPath()) == pchSources.end()) {
        depList.push_back(
          this->GeneratorTarget->GetPchFile(config, language, arch));
      }
    }
  }

  if (cmValue objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> objDepList = cmExpandedList(*objectDeps);
    std::copy(objDepList.begin(), objDepList.end(),
              std::back_inserter(depList));
  }

  if (!depList.empty()) {
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(objBuild.ImplicitDeps),
                   this->MapToNinjaPath());
  }

  objBuild.OrderOnlyDeps.push_back(this->OrderDependsTargetForTarget(config));

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFilePath)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(
      sourceFilePath, objBuild.OrderOnlyDeps);
  }

  // For some cases we scan to dynamically discover dependencies.
  bool const needDyndep = this->NeedDyndep(language, config);
  bool const compilationPreprocesses =
    !this->NeedExplicitPreprocessing(language);

  std::string modmapFormat;
  if (needDyndep) {
    std::string const modmapFormatVar =
      cmStrCat("CMAKE_EXPERIMENTAL_", language, "_MODULE_MAP_FORMAT");
    modmapFormat = this->Makefile->GetSafeDefinition(modmapFormatVar);
  }

  if (needDyndep) {
    // If source/target has preprocessing turned off, we still need to
    // generate an explicit dependency step
    const auto srcpp = source->GetSafeProperty("Fortran_PREPROCESS");
    cmOutputConverter::FortranPreprocess preprocess =
      cmOutputConverter::GetFortranPreprocess(srcpp);
    if (preprocess == cmOutputConverter::FortranPreprocess::Unset) {
      const auto& tgtpp =
        this->GeneratorTarget->GetSafeProperty("Fortran_PREPROCESS");
      preprocess = cmOutputConverter::GetFortranPreprocess(tgtpp);
    }

    bool const compilePP = !compilationPreprocesses &&
      (preprocess != cmOutputConverter::FortranPreprocess::NotNeeded);
    bool const compilePPWithDefines =
      compilePP && this->CompileWithDefines(language);

    std::string scanRuleName;
    std::string ppFileName;
    if (compilePP) {
      scanRuleName = this->LanguagePreprocessAndScanRule(language, config);
      ppFileName = this->ConvertToNinjaPath(
        this->GetPreprocessedFilePath(source, config));
    } else {
      scanRuleName = this->LanguageScanRule(language, config);
      ppFileName = cmStrCat(objectFileName, ".ddi.i");
    }

    cmNinjaBuild ppBuild = GetScanBuildStatement(
      scanRuleName, ppFileName, compilePP, compilePPWithDefines, objBuild,
      vars, modmapFormat, objectFileName, this->LocalGenerator);

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const& postFlag = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_POSTPROCESS_FLAG"));
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);

      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, config, false);

      vars["INCLUDES"] = cmStrCat(sourceDirectoryFlag, ' ', vars["INCLUDES"]);
    }

    if (firstForConfig) {
      std::string const ddiFile = cmStrCat(objectFileName, ".ddi");
      this->Configs[config].DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppBuild.Variables);

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           ppBuild, commandLineLengthLimit);

    std::string const dyndep = this->GetDyndepFilePath(language, config);
    objBuild.OrderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;

    if (!modmapFormat.empty()) {
      std::string const ddModmapFile = cmStrCat(objectFileName, ".modmap");
      vars["DYNDEP_MODULE_MAP_FILE"] = ddModmapFile;
      objBuild.OrderOnlyDeps.push_back(ddModmapFile);
    }
  }

  this->EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      this->addPoolNinjaVariable("JOB_POOL_PRECOMPILE_HEADER",
                                 this->GetGeneratorTarget(), vars);
    }
  }

  this->SetMsvcTargetPdbVariable(vars, config);

  objBuild.RspFile = cmStrCat(objectFileName, ".rsp");

  if (language == "ISPC") {
    std::string const& objectName =
      this->GeneratorTarget->GetObjectName(source);
    std::string ispcSource =
      cmSystemTools::GetFilenameWithoutLastExtension(objectName);
    ispcSource = cmSystemTools::GetFilenameWithoutLastExtension(ispcSource);

    cmValue ispcSuffixProp =
      this->GeneratorTarget->GetProperty("ISPC_HEADER_SUFFIX");
    assert(ispcSuffixProp);

    std::string ispcHeaderDirectory =
      this->GeneratorTarget->GetObjectDirectory(config);
    if (cmValue prop =
          this->GeneratorTarget->GetProperty("ISPC_HEADER_DIRECTORY")) {
      ispcHeaderDirectory =
        cmStrCat(this->LocalGenerator->GetBinaryDirectory(), '/', *prop);
    }

    std::string ispcHeader =
      cmStrCat(ispcHeaderDirectory, '/', ispcSource, *ispcSuffixProp);
    ispcHeader = this->ConvertToNinjaPath(ispcHeader);

    // Make sure ninja knows what command generates the header
    objBuild.ImplicitOuts.push_back(ispcHeader);

    // Make sure ninja knows how to clean the generated header
    this->GetGlobalGenerator()->AddAdditionalCleanFile(ispcHeader, config);

    auto ispcSuffixes =
      detail::ComputeISPCObjectSuffixes(this->GeneratorTarget);
    if (ispcSuffixes.size() > 1) {
      std::string rootObjectDir =
        this->GeneratorTarget->GetObjectDirectory(config);
      auto ispcSideEfffectObjects = detail::ComputeISPCExtraObjects(
        objectName, rootObjectDir, ispcSuffixes);

      for (auto sideEffect : ispcSideEfffectObjects) {
        sideEffect = this->ConvertToNinjaPath(sideEffect);
        objBuild.ImplicitOuts.emplace_back(sideEffect);
        this->GetGlobalGenerator()->AddAdditionalCleanFile(sideEffect, config);
      }
    }

    vars["ISPC_HEADER_FILE"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ispcHeader, cmOutputConverter::SHELL);
  } else {
    auto headers = this->GeneratorTarget->GetGeneratedISPCHeaders(config);
    if (!headers.empty()) {
      std::transform(headers.begin(), headers.end(), headers.begin(),
                     this->MapToNinjaPath());
      objBuild.OrderOnlyDeps.insert(objBuild.OrderOnlyDeps.end(),
                                    headers.begin(), headers.end());
    }
  }

  if (language == "Swift") {
    this->EmitSwiftDependencyInfo(source, config);
  } else {
    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           objBuild, commandLineLengthLimit);
  }

  if (cmValue objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    std::string evaluatedObjectOutputs = cmGeneratorExpression::Evaluate(
      *objectOutputs, this->LocalGenerator, config);

    if (!evaluatedObjectOutputs.empty()) {
      cmNinjaBuild build("phony");
      build.Comment = "Additional output files.";
      build.Outputs = cmExpandedList(evaluatedObjectOutputs);
      std::transform(build.Outputs.begin(), build.Outputs.end(),
                     build.Outputs.begin(), this->MapToNinjaPath());
      build.ExplicitDeps = objBuild.Outputs;
      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), build);
    }
  }
}